

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparator.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_2::BytewiseComparatorImpl::FindShortSuccessor
          (BytewiseComparatorImpl *this,string *key)

{
  char cVar1;
  pointer pcVar2;
  long lVar3;
  
  lVar3 = 1;
  while( true ) {
    if (lVar3 - key->_M_string_length == 1) {
      return;
    }
    pcVar2 = (key->_M_dataplus)._M_p;
    cVar1 = pcVar2[lVar3 + -1];
    if (cVar1 != -1) break;
    lVar3 = lVar3 + 1;
  }
  pcVar2[lVar3 + -1] = cVar1 + '\x01';
  std::__cxx11::string::resize((ulong)key);
  return;
}

Assistant:

void FindShortSuccessor(std::string* key) const override {
    // Find first character that can be incremented
    size_t n = key->size();
    for (size_t i = 0; i < n; i++) {
      const uint8_t byte = (*key)[i];
      if (byte != static_cast<uint8_t>(0xff)) {
        (*key)[i] = byte + 1;
        key->resize(i + 1);
        return;
      }
    }
    // *key is a run of 0xffs.  Leave it alone.
  }